

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O2

void __thiscall QAbstractSpinBoxPrivate::updateEditFieldGeometry(QAbstractSpinBoxPrivate *this)

{
  long lVar1;
  QWidget *this_00;
  QWidget *this_01;
  QStyle *pQVar2;
  long in_FS_OFFSET;
  QRect local_88;
  QStyleOptionSpinBox opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  opt._80_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOptionComplex._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOptionComplex.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOptionComplex.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOptionComplex.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOptionComplex.super_QStyleOption.palette.d =
       (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOptionComplex.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOptionComplex.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOptionComplex.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOptionComplex.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionSpinBox::QStyleOptionSpinBox(&opt);
  (**(code **)(*(long *)this_00 + 0x1c0))(this_00,&opt);
  opt.super_QStyleOptionComplex.subControls.super_QFlagsStorageHelper<QStyle::SubControl,_4>.
  super_QFlagsStorage<QStyle::SubControl>.i = (QFlagsStorageHelper<QStyle::SubControl,_4>)0x8;
  this_01 = &this->edit->super_QWidget;
  pQVar2 = QWidget::style(this_00);
  local_88 = (QRect)(**(code **)(*(long *)pQVar2 + 0xd8))(pQVar2,0,&opt,8,this_00);
  QWidget::setGeometry(this_01,&local_88);
  QStyleOption::~QStyleOption((QStyleOption *)&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractSpinBoxPrivate::updateEditFieldGeometry()
{
    Q_Q(QAbstractSpinBox);
    QStyleOptionSpinBox opt;
    q->initStyleOption(&opt);
    opt.subControls = QStyle::SC_SpinBoxEditField;
    edit->setGeometry(q->style()->subControlRect(QStyle::CC_SpinBox, &opt,
                                                 QStyle::SC_SpinBoxEditField, q));
}